

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetWindowCollapsed(char *name,bool collapsed,ImGuiCond cond)

{
  ImU32 key;
  void *pvVar1;
  
  key = ImHashStr(name,0,0);
  pvVar1 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
  if ((pvVar1 != (void *)0x0) && ((cond == 0 || ((cond & *(uint *)((long)pvVar1 + 0xac)) != 0)))) {
    *(uint *)((long)pvVar1 + 0xac) = *(uint *)((long)pvVar1 + 0xac) & 0xfffffff1;
    *(bool *)((long)pvVar1 + 0x81) = collapsed;
  }
  return;
}

Assistant:

void ImGui::SetWindowCollapsed(const char* name, bool collapsed, ImGuiCond cond)
{
    if (ImGuiWindow* window = FindWindowByName(name))
        SetWindowCollapsed(window, collapsed, cond);
}